

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O1

int process_tick(DUMB_IT_SIGRENDERER *sigrenderer)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  DUMB_IT_SIGDATA *pDVar5;
  IT_PATTERN *pIVar6;
  _func_int_void_ptr *p_Var7;
  byte *pbVar8;
  IT_PLAYING *pIVar9;
  uchar *puVar10;
  uchar uVar11;
  uint uVar12;
  int iVar13;
  int iVar14;
  void *pvVar15;
  ulong uVar16;
  char cVar17;
  ushort uVar18;
  long lVar19;
  IT_ENTRY *pIVar20;
  char *pcVar21;
  int iVar22;
  uint uVar23;
  byte bVar24;
  uint uVar25;
  ulong uVar26;
  IT_CHANNEL *pIVar27;
  int i;
  long lVar28;
  float fVar29;
  double dVar30;
  double dVar31;
  float fVar32;
  
  pDVar5 = sigrenderer->sigdata;
  iVar13 = sigrenderer->speed;
  if (iVar13 == 0) {
LAB_005b2adc:
    if (((pDVar5->flags & 0x1000) != 0) && ((sigrenderer->tick & 0xf) != 0)) goto LAB_005b34de;
  }
  else {
    piVar1 = &sigrenderer->tick;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) goto LAB_005b2adc;
    lVar28 = 0x35;
    do {
      pcVar21 = sigrenderer->channel[0].arpeggio_offsets + lVar28 + -0x52;
      pcVar21[0] = '\0';
      pcVar21[1] = '\0';
      sigrenderer->channel[0].arpeggio_offsets[lVar28 + -0x50] = '\0';
      lVar28 = lVar28 + 0xa0;
    } while (lVar28 != 0x2835);
    sigrenderer->tick = iVar13;
    piVar1 = &sigrenderer->rowcount;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 != 0) {
      for (pIVar20 = sigrenderer->entry;
          (pIVar20 < sigrenderer->entry_end && (pIVar20->channel < 0x40)); pIVar20 = pIVar20 + 1) {
        if (((pIVar20->mask & 8) != 0) && (pIVar20->effect != '\x0f')) {
          process_effects(sigrenderer,pIVar20,0);
        }
      }
LAB_005b34d6:
      update_effects(sigrenderer);
      goto LAB_005b34de;
    }
    sigrenderer->rowcount = 1;
    if (sigrenderer->n_rows != 0) {
      bit_array_set(sigrenderer->played,(long)sigrenderer->row + (long)sigrenderer->order * 0x100);
      lVar28 = 0xb8;
      do {
        pvVar15 = *(void **)(sigrenderer->channel[0].arpeggio_offsets + lVar28 + -0x58);
        if (pvVar15 != (void *)0x0) {
          if (*(int *)(sigrenderer->channel[0].arpeggio_offsets + lVar28 + -0x50) ==
              sigrenderer->order) {
            bit_array_set(pvVar15,(long)sigrenderer->row);
          }
          else {
            bit_array_destroy(pvVar15);
            *(undefined8 *)(sigrenderer->channel[0].arpeggio_offsets + lVar28 + -0x58) = 0;
            *(undefined4 *)(sigrenderer->channel[0].arpeggio_offsets + lVar28 + -0x50) = 0xfffe;
          }
        }
        lVar28 = lVar28 + 0xa0;
      } while (lVar28 != 0x28b8);
    }
    uVar12 = sigrenderer->processrow + 1;
    sigrenderer->processrow = uVar12;
    if ((int)uVar12 < sigrenderer->n_rows) {
      if (sigrenderer->entry == (IT_ENTRY *)0x0) {
        bit_array_clear(sigrenderer->played,(long)sigrenderer->order << 8);
        sigrenderer->entry = sigrenderer->entry_start;
        sigrenderer->row = 0;
      }
      else {
        pIVar20 = sigrenderer->entry;
        if (pIVar20 < sigrenderer->entry_end) {
          do {
            puVar10 = &pIVar20->channel;
            pIVar20 = pIVar20 + 1;
            if (0x3f < *puVar10) break;
          } while (pIVar20 < sigrenderer->entry_end);
          sigrenderer->entry = pIVar20;
        }
        sigrenderer->row = sigrenderer->row + 1;
      }
LAB_005b2fd8:
      if ((pDVar5->flags & 0x400) == 0) {
        sigrenderer->globalvolslide = '\0';
        sigrenderer->temposlide = '\0';
        lVar28 = 0x20;
        do {
          reset_channel_effects
                    ((IT_CHANNEL *)(sigrenderer->channel[0].arpeggio_offsets + lVar28 + -0x50));
          lVar28 = lVar28 + 0xa0;
        } while (lVar28 != 0x2820);
      }
      pIVar20 = sigrenderer->entry;
      uVar12 = 0;
      if (pIVar20 < sigrenderer->entry_end) {
        uVar12 = 0;
        do {
          if (0x3f < pIVar20->channel) break;
          uVar23 = 0;
          uVar25 = 0;
          if ((pIVar20->mask & 8) != 0) {
            if (pIVar20->effect == '\x13') {
              uVar16 = (ulong)((uint)pIVar20->channel * 0xa0);
              bVar24 = pIVar20->effectvalue;
              uVar4 = sigrenderer->sigdata->flags;
              if ((uVar4 >> 8 & 1) == 0) {
                if (bVar24 == 0) {
                  bVar24 = sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x41];
                }
              }
              else {
                if (bVar24 == 0) {
                  bVar24 = sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x31];
                }
                sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x31] = bVar24;
              }
              sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x41] = bVar24;
              uVar23 = uVar25;
              if (bVar24 >> 4 == 0xe) {
                sigrenderer->rowcount = (bVar24 & 0xf) + 1;
              }
              else if (bVar24 >> 4 == 0xb) {
                if ((bVar24 & 0xf) == 0) {
                  pvVar15 = *(void **)(sigrenderer->channel[0].arpeggio_offsets + uVar16 + 0x60);
                  if (pvVar15 == (void *)0x0) {
                    pvVar15 = bit_array_create(0x100);
                    *(void **)(sigrenderer->channel[0].arpeggio_offsets + uVar16 + 0x60) = pvVar15;
                  }
                  else {
                    iVar13 = *(int *)(sigrenderer->channel[0].arpeggio_offsets + uVar16 + 0x68);
                    if (((long)iVar13 != 0xfffe) && (iVar13 != sigrenderer->order)) {
                      bit_array_merge(sigrenderer->played,pvVar15,(long)iVar13 << 8);
                    }
                    bit_array_reset(*(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                              uVar16 + 0x60));
                  }
                  *(int *)(sigrenderer->channel[0].arpeggio_offsets + uVar16 + 0x68) =
                       sigrenderer->order;
                  sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x42] =
                       (char)sigrenderer->processrow;
                }
                else {
                  cVar17 = sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x43];
                  if (cVar17 == '\0') {
                    iVar13 = *(int *)(sigrenderer->channel[0].arpeggio_offsets + uVar16 + 0x68);
                    if (iVar13 == 0xfffe) {
                      bit_array_destroy(*(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                                  uVar16 + 0x60));
                      pvVar15 = bit_array_create(0x100);
                      *(void **)(sigrenderer->channel[0].arpeggio_offsets + uVar16 + 0x60) = pvVar15
                      ;
                      bVar2 = sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x42];
                      uVar26 = (ulong)bVar2;
                      if ((int)(uint)bVar2 <= sigrenderer->row) {
                        do {
                          bit_array_clear(sigrenderer->played,
                                          (long)sigrenderer->order * 0x100 + uVar26);
                          iVar13 = (int)uVar26;
                          uVar26 = uVar26 + 1;
                        } while (iVar13 < sigrenderer->row);
                      }
                      *(int *)(sigrenderer->channel[0].arpeggio_offsets + uVar16 + 0x68) =
                           sigrenderer->order;
                    }
                    else if (iVar13 == sigrenderer->order) {
                      bit_array_set(*(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                              uVar16 + 0x60),(long)sigrenderer->row);
                      bit_array_mask(sigrenderer->played,
                                     *(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                               uVar16 + 0x60),
                                     (long)*(int *)(sigrenderer->channel[0].arpeggio_offsets +
                                                   uVar16 + 0x68) << 8);
                    }
                    sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x43] = bVar24 & 0xf;
                  }
                  else {
                    cVar17 = cVar17 + -1;
                    sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x43] = cVar17;
                    if (cVar17 == '\0') {
                      if ((uVar4 & 0xc0) == 0x40) {
                        sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x44] = '\0';
                        if ((int)(sigrenderer->processrow | 0xc00U) < 0xfffe) {
                          sigrenderer->breakrow =
                               (uint)(byte)sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x42];
                        }
                      }
                      else {
                        sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x42] =
                             (char)sigrenderer->processrow + '\x01';
                      }
                      if (*(int *)(sigrenderer->channel[0].arpeggio_offsets + uVar16 + 0x68) ==
                          sigrenderer->order) {
                        bit_array_destroy(*(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                                    uVar16 + 0x60));
                        *(undefined8 *)(sigrenderer->channel[0].arpeggio_offsets + uVar16 + 0x60) =
                             0;
                        *(undefined4 *)(sigrenderer->channel[0].arpeggio_offsets + uVar16 + 0x68) =
                             0xfffe;
                      }
                      bit_array_clear(sigrenderer->played,
                                      (long)sigrenderer->row + (long)sigrenderer->order * 0x100);
                      goto LAB_005b33c2;
                    }
                    if (*(int *)(sigrenderer->channel[0].arpeggio_offsets + uVar16 + 0x68) ==
                        sigrenderer->order) {
                      bit_array_set(*(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                              uVar16 + 0x60),(long)sigrenderer->row);
                      bit_array_mask(sigrenderer->played,
                                     *(void **)(sigrenderer->channel[0].arpeggio_offsets +
                                               uVar16 + 0x60),
                                     (long)*(int *)(sigrenderer->channel[0].arpeggio_offsets +
                                                   uVar16 + 0x68) << 8);
                    }
                  }
                  sigrenderer->breakrow =
                       (uint)(byte)sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x42];
                  if ((sigrenderer->sigdata->flags & 0xc0U) == 0x40) {
                    uVar25 = sigrenderer->processrow;
                    uVar23 = 1;
                    if ((int)(uVar25 | 0xc00) < 0xfffe) {
                      if ((int)uVar25 <
                          (int)(uint)(byte)sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x44])
                      {
                        sigrenderer->processorder = 0xfffe;
                      }
                      else {
                        sigrenderer->processorder = 0xffff;
                      }
                      sigrenderer->channel[0].arpeggio_offsets[uVar16 + 0x44] = (char)uVar25;
                      sigrenderer->processrow = 0xffff;
                    }
                  }
                  else {
                    sigrenderer->processorder = 0xffff;
                    sigrenderer->processrow = 0xfffe;
                    uVar23 = 1;
                  }
                }
              }
            }
            else if (pIVar20->effect == '\x02') {
              iVar13 = 0xf3fe;
              if ((sigrenderer->processrow & 0xfffffbffU) != 0xf3fe) {
                sigrenderer->breakrow = 0;
                iVar13 = 0xfbfe;
              }
              sigrenderer->processrow = iVar13;
              sigrenderer->processorder = pIVar20->effectvalue - 1;
            }
          }
LAB_005b33c2:
          pIVar20 = pIVar20 + 1;
          uVar12 = uVar12 | uVar23;
        } while (pIVar20 < sigrenderer->entry_end);
      }
      for (pIVar20 = sigrenderer->entry;
          (pIVar20 < sigrenderer->entry_end && (pIVar20->channel < 0x40)); pIVar20 = pIVar20 + 1) {
        uVar23 = 0;
        if ((pDVar5->flags & 0x40) == 0) {
          uVar23 = uVar12;
        }
        pIVar27 = (IT_CHANNEL *)
                  (sigrenderer->channel[0].arpeggio_offsets +
                  ((ulong)((uint)pIVar20->channel * 0xa0) - 0x30));
        bVar24 = pIVar20->mask;
        if ((bVar24 & 1) != 0) {
          pIVar27->note = pIVar20->note;
        }
        if (((bVar24 & 9) != 0) && ((sigrenderer->sigdata->flags & 0x400) != 0)) {
          reset_channel_effects(pIVar27);
          if (pIVar27->playing != (IT_PLAYING *)0x0) {
            pIVar27->playing->finetune = 0;
          }
        }
        if ((((pIVar20->mask & 8) == 0) || (pIVar20->effect != '\x13')) ||
           ((pIVar27->lastS & 0xf0) != 0xd0)) {
          iVar13 = process_note_data(sigrenderer,pIVar20,uVar23);
          if (iVar13 != 0) {
            return 1;
          }
        }
        else {
          bVar24 = pIVar27->lastS & 0xf;
          if (bVar24 < 2) {
            bVar24 = 1;
          }
          pIVar27->note_delay_count = bVar24;
          pIVar27->note_delay_entry = pIVar20;
        }
      }
      if (((uint)pDVar5->flags >> 0xb & 1) == 0) {
        if ((pDVar5->flags & 0x10U) == 0) {
          update_smooth_effects(sigrenderer);
        }
        goto LAB_005b34de;
      }
      goto LAB_005b34d6;
    }
    iVar13 = sigrenderer->processorder;
    sigrenderer->processrow = sigrenderer->breakrow;
    sigrenderer->breakrow = 0;
    if ((uVar12 & 0xfffff3ff) == 0xf3ff) {
      lVar28 = 0x94;
      do {
        sigrenderer->channel[0].arpeggio_offsets[lVar28 + -0x50] = '\0';
        lVar28 = lVar28 + 0xa0;
      } while (lVar28 != 0x2894);
    }
    if (iVar13 == 0xffff) {
      sigrenderer->processorder = sigrenderer->order + -1;
    }
LAB_005b2e39:
    while( true ) {
      iVar22 = sigrenderer->processorder + 1;
      sigrenderer->processorder = iVar22;
      iVar14 = pDVar5->n_orders;
      if (iVar22 < iVar14) break;
      sigrenderer->processorder = sigrenderer->restart_position;
      if (sigrenderer->restart_position < iVar14) {
        if ((pDVar5->flags & 0x800) != 0) {
          sigrenderer->speed = pDVar5->speed;
          sigrenderer->tempo = pDVar5->tempo;
          lVar28 = 0x20;
          do {
            xm_note_off(pDVar5,(IT_CHANNEL *)
                               (sigrenderer->channel[0].arpeggio_offsets + lVar28 + -0x50));
            lVar28 = lVar28 + 0xa0;
          } while (lVar28 != 0x2820);
        }
        break;
      }
      sigrenderer->processorder = -1;
    }
    iVar14 = sigrenderer->processorder;
    bVar24 = pDVar5->order[iVar14];
    if (pDVar5->n_patterns <= (int)(uint)bVar24) {
      if (bVar24 != 0xfe) {
        sigrenderer->processorder = sigrenderer->restart_position + -1;
      }
      lVar28 = 0;
      do {
        bit_array_set(sigrenderer->played,(long)sigrenderer->processorder * 0x100 + lVar28);
        lVar28 = lVar28 + 1;
      } while ((int)lVar28 != 0x100);
      goto LAB_005b2e39;
    }
    pIVar6 = pDVar5->pattern;
    iVar22 = sigrenderer->n_rows;
    iVar3 = pIVar6[bVar24].n_rows;
    sigrenderer->n_rows = iVar3;
    if (iVar3 <= sigrenderer->processrow) {
      sigrenderer->processrow = 0;
    }
    pIVar20 = pIVar6[bVar24].entry;
    sigrenderer->entry_start = pIVar20;
    sigrenderer->entry = pIVar20;
    sigrenderer->entry_end = pIVar20 + pIVar6[bVar24].n_entries;
    if (iVar22 == 0) {
LAB_005b2f75:
      iVar13 = sigrenderer->processrow;
      sigrenderer->order = sigrenderer->processorder;
      if (iVar13 != 0) {
        pIVar20 = sigrenderer->entry;
        iVar14 = iVar13;
        do {
          if (pIVar20 < sigrenderer->entry_end) {
            do {
              puVar10 = &pIVar20->channel;
              pIVar20 = pIVar20 + 1;
              if (0x3f < *puVar10) break;
            } while (pIVar20 < sigrenderer->entry_end);
            sigrenderer->entry = pIVar20;
          }
          iVar14 = iVar14 + -1;
        } while (iVar14 != 0);
      }
      sigrenderer->row = iVar13;
      iVar14 = 0;
    }
    else {
      if (iVar13 != 0xffff) {
        if (iVar14 <= sigrenderer->order) goto LAB_005b2f20;
        goto LAB_005b2f75;
      }
      if (sigrenderer->order <= iVar14) goto LAB_005b2f75;
LAB_005b2f20:
      iVar13 = bit_array_test(sigrenderer->played,
                              (long)sigrenderer->processrow + (long)iVar14 * 0x100);
      if (iVar13 == 0) goto LAB_005b2f75;
      p_Var7 = sigrenderer->callbacks->loop;
      if (p_Var7 == (_func_int_void_ptr *)0x0) goto LAB_005b2f75;
      iVar13 = (*p_Var7)(sigrenderer->callbacks->loop_data);
      iVar14 = 1;
      if (iVar13 == 0) {
        bit_array_reset(sigrenderer->played);
        if (sigrenderer->speed != 0) goto LAB_005b2f75;
        iVar14 = 0x10;
      }
    }
    if (iVar14 == 0) goto LAB_005b2fd8;
    if (iVar14 != 0x10) {
      return 1;
    }
  }
  update_effects(sigrenderer);
  lVar28 = 0;
  do {
    pIVar27 = sigrenderer->channel + lVar28;
    uVar11 = sigrenderer->channel[lVar28].key_off_count;
    if (uVar11 == '\0') {
      if (pIVar27->note_cut_count == '\0') {
        if ((pIVar27->note_delay_count != '\0') &&
           (uVar11 = pIVar27->note_delay_count + 0xff, pIVar27->note_delay_count = uVar11,
           uVar11 == '\0')) {
          process_note_data(sigrenderer,pIVar27->note_delay_entry,0);
        }
      }
      else {
        uVar11 = pIVar27->note_cut_count + 0xff;
        pIVar27->note_cut_count = uVar11;
        if (uVar11 == '\0') {
          if ((sigrenderer->sigdata->flags & 0x240) == 0) {
            pIVar9 = pIVar27->playing;
            if (pIVar9 != (IT_PLAYING *)0x0) {
              lVar19 = 0;
              do {
                if (sigrenderer->playing[lVar19] == (IT_PLAYING *)0x0) {
                  pIVar9->declick_stage = '\x03';
                  sigrenderer->playing[lVar19] = pIVar9;
                  pIVar27->playing = (IT_PLAYING *)0x0;
                  break;
                }
                lVar19 = lVar19 + 1;
              } while (lVar19 != 0xc0);
              pIVar9 = pIVar27->playing;
              if (pIVar9 != (IT_PLAYING *)0x0) {
                pIVar9->next = sigrenderer->free_playing;
                sigrenderer->free_playing = pIVar9;
                pIVar27->playing = (IT_PLAYING *)0x0;
              }
            }
          }
          else {
            pIVar27->volume = '\0';
          }
        }
      }
    }
    else {
      uVar11 = uVar11 + 0xff;
      pIVar27->key_off_count = uVar11;
      if (uVar11 == '\0') {
        xm_note_off(sigrenderer->sigdata,pIVar27);
      }
    }
    lVar28 = lVar28 + 1;
  } while (lVar28 != 0x40);
LAB_005b34de:
  p_Var7 = sigrenderer->callbacks->global_volume_zero;
  if (sigrenderer->globalvolume == '\0') {
    if (p_Var7 != (_func_int_void_ptr *)0x0) {
      iVar13 = ((int)(0x2800000 / (long)(sigrenderer->tempo << 8)) * 0x10000 +
                sigrenderer->gvz_sub_time >> 0x10) + sigrenderer->gvz_time;
      sigrenderer->gvz_time = iVar13;
      sigrenderer->gvz_sub_time = sigrenderer->gvz_sub_time & 0xffff;
      if ((0xbffff < iVar13) &&
         (iVar13 = (*p_Var7)(sigrenderer->callbacks->global_volume_zero_data), iVar13 != 0)) {
        return 1;
      }
    }
  }
  else if (p_Var7 != (_func_int_void_ptr *)0x0) {
    sigrenderer->gvz_time = 0;
    sigrenderer->gvz_sub_time = 0;
  }
  pDVar5 = sigrenderer->sigdata;
  iVar13 = sigrenderer->tempo;
  lVar28 = 0;
  do {
    pbVar8 = *(byte **)(sigrenderer->channel[0].arpeggio_offsets + lVar28 + 0x58);
    if (pbVar8 == (byte *)0x0) goto LAB_005b38e4;
    switch(pbVar8[0x55]) {
    case 1:
      uVar16 = (ulong)pbVar8[0x54];
      pcVar21 = 
      "@??>>==<<;;::99887766554433221100//..--,,++**))((\'\'&&%%$$##\"\"!!  \x1f\x1f\x1e\x1e\x1d\x1d\x1c\x1c\x1b\x1b\x1a\x1a\x19\x19\x18\x18\x17\x17\x16\x16\x15\x15\x14\x14\x13\x13\x12\x12\x11\x11\x10\x10\x0f\x0f\x0e\x0e\r\r\f\f\v\v\n\n\t\t\b\b\a\a\x06\x06\x05\x05\x04\x04\x03\x03\x02\x02\x01\x01"
      ;
      break;
    case 2:
      uVar16 = (ulong)pbVar8[0x54];
      pcVar21 = 
      "@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@"
      ;
      break;
    case 3:
      iVar14 = rand();
      iVar14 = iVar14 % 0x81 + -0x40;
      goto LAB_005b3610;
    case 4:
      uVar16 = (ulong)pbVar8[0x54];
      pcVar21 = it_xm_squarewave;
      break;
    case 5:
      uVar16 = (ulong)pbVar8[0x54];
      goto LAB_005b35f7;
    case 6:
      uVar16 = (ulong)pbVar8[0x54] ^ 0xff;
LAB_005b35f7:
      pcVar21 = "";
      break;
    default:
      uVar16 = (ulong)pbVar8[0x54];
      pcVar21 = "";
    }
    iVar14 = (int)pcVar21[uVar16];
LAB_005b3610:
    iVar22 = (int)((uint)pbVar8[0x52] * (uint)pbVar8[0x53] * iVar14) >> 4;
    uVar12 = pDVar5->flags;
    iVar14 = -iVar22;
    if ((uVar12 & 0x10) == 0) {
      iVar14 = iVar22;
    }
    bVar24 = sigrenderer->channel[0].arpeggio_offsets[lVar28 + -0x2c];
    pbVar8[0x45] = bVar24;
    uVar18 = *(ushort *)(sigrenderer->channel[0].arpeggio_offsets + lVar28 + -0x26);
    *(ushort *)(pbVar8 + 0x46) = uVar18;
    bVar2 = pbVar8[0x48];
    if ((bVar2 != 0) &&
       (bVar24 = (char)((uint)bVar24 * (int)(char)bVar2 >> 7) + bVar24, pbVar8[0x45] = bVar24,
       0x40 < bVar24)) {
      pbVar8[0x45] = (byte)~bVar2 >> 1 & 0x40;
    }
    bVar24 = pbVar8[0x49];
    if (((bVar24 != 0) && (uVar18 < 0x4001)) &&
       (uVar18 = uVar18 + (ushort)bVar24 * 0x100, *(ushort *)(pbVar8 + 0x46) = uVar18,
       0x4000 < uVar18)) {
      *(ushort *)(pbVar8 + 0x46) = (ushort)(-1 < (char)bVar24) << 0xe;
    }
    if ((uVar12 & 8) == 0) {
      iVar22 = *(int *)(pbVar8 + 0x68);
      dVar30 = exp2((double)(int)(0x3c00 - ((uint)pbVar8[0x4a] * 0x100 + *(int *)(pbVar8 + 0x70))) *
                    0.0003255208333333158);
      *(float *)(pbVar8 + 0x6c) = (float)dVar30;
      fVar29 = (float)(iVar14 + iVar22) * -1.7621046e-08 +
               (float)dVar30 / (float)*(int *)(*(long *)(pbVar8 + 0x10) + 0x44);
      *(float *)(pbVar8 + 0x6c) = fVar29;
      if (fVar29 < 4.656613e-10) {
        *pbVar8 = *pbVar8 | 8;
        fVar32 = 3.0517578e-05;
      }
      else {
        fVar32 = 1.5258789e-05 / fVar29;
      }
      *(float *)(pbVar8 + 0x6c) = fVar32;
      if (4.656613e-10 <= fVar29) goto LAB_005b37ba;
    }
    else {
      iVar14 = *(int *)(pbVar8 + 0x70) +
               iVar14 + *(int *)(pbVar8 + 0x68) + (uint)pbVar8[0x4a] * 0x100 + -0x3c00;
      dVar30 = -10.666666666666092;
      if (-0x8001 < iVar14) {
        if (0x7ffe < iVar14) {
          iVar14 = 0x7fff;
        }
        dVar30 = (double)iVar14 * 0.0003255208333333158;
      }
      dVar30 = exp2(dVar30);
      *(float *)(pbVar8 + 0x6c) = (float)dVar30;
      *(float *)(pbVar8 + 0x6c) =
           (float)dVar30 * 1.5258789e-05 * (float)*(int *)(*(long *)(pbVar8 + 0x10) + 0x44);
LAB_005b37ba:
      lVar19 = *(long *)(pbVar8 + 8);
      if (((*(char *)(lVar19 + 0x5b) != '\0') && (*(int *)(lVar19 + 0x4c) != 0)) &&
         (*(byte *)(lVar19 + 0x59) < 0x78)) {
        iVar14 = *(int *)(*(long *)(pbVar8 + 0x10) + 0x44);
        dVar30 = log((double)((*(float *)(pbVar8 + 0x6c) * 65536.0) / (float)iVar14));
        dVar31 = dVar30 * 17.31234049066756 + 60.5;
        dVar30 = 119.0;
        if ((dVar31 <= 119.0) && (dVar30 = dVar31, dVar31 < 0.0)) {
          dVar30 = 0.0;
        }
        dVar30 = exp2((double)((int)dVar30 + -0x3c) * 0.0833333333333334);
        *(float *)(pbVar8 + 0x6c) = (float)iVar14 * 1.5258789e-05 * (float)dVar30;
      }
      uVar12 = sigrenderer->tick;
      uVar23 = sigrenderer->speed - uVar12;
      if (uVar23 == 0) {
        uVar12 = 0;
      }
      if ((sigrenderer->sigdata->flags & 0xc0U) != 0x40) {
        uVar12 = uVar23;
      }
      dVar30 = exp2((double)(int)sigrenderer->channel[0].arpeggio_offsets
                                 [(ulong)*(byte *)(*(long *)(sigrenderer->channel[0].
                                                             arpeggio_offsets + lVar28 + -8) +
                                                  (ulong)(uVar12 & 0x1f)) + lVar28] *
                    0.0833333333333334);
      *(float *)(pbVar8 + 0x6c) = (float)dVar30 * *(float *)(pbVar8 + 0x6c);
      pbVar8[0x4c] = sigrenderer->channel[0].arpeggio_offsets[lVar28 + -0x1f];
      pbVar8[0x4d] = sigrenderer->channel[0].arpeggio_offsets[lVar28 + -0x1e];
    }
LAB_005b38e4:
    lVar28 = lVar28 + 0xa0;
    if (lVar28 == 0x2800) {
      fVar29 = (float)iVar13 * 6.1035157e-06;
      lVar28 = 0xa8;
      do {
        pIVar9 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar28 + -0x50);
        if (((pIVar9 != (IT_PLAYING *)0x0) &&
            (process_playing(sigrenderer,pIVar9,fVar29), (pDVar5->flags & 0x40) == 0)) &&
           (pIVar9 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar28 + -0x50),
           (pIVar9->flags & 8) != 0)) {
          pIVar9->next = sigrenderer->free_playing;
          sigrenderer->free_playing = pIVar9;
          *(undefined8 *)(sigrenderer->channel[0].arpeggio_offsets + lVar28 + -0x50) = 0;
        }
        lVar28 = lVar28 + 0xa0;
      } while (lVar28 != 0x28a8);
      lVar28 = 0x504;
      do {
        pIVar9 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar28 * 8 + -0x50);
        if (pIVar9 != (IT_PLAYING *)0x0) {
          process_playing(sigrenderer,pIVar9,fVar29);
          pIVar9 = *(IT_PLAYING **)(sigrenderer->channel[0].arpeggio_offsets + lVar28 * 8 + -0x50);
          if ((pIVar9->flags & 8) != 0) {
            pIVar9->next = sigrenderer->free_playing;
            sigrenderer->free_playing = pIVar9;
            *(undefined8 *)(sigrenderer->channel[0].arpeggio_offsets + lVar28 * 8 + -0x50) = 0;
          }
        }
        lVar28 = lVar28 + 1;
      } while (lVar28 != 0x5c4);
      lVar28 = (long)sigrenderer->sub_time_left +
               ((long)((int)(0x2800000 / (long)(sigrenderer->tempo << 8)) << 0x10) >>
               ((byte)((uint)sigrenderer->sigdata->flags >> 10) & 4));
      sigrenderer->time_left = sigrenderer->time_left + (int)((ulong)lVar28 >> 0x10);
      sigrenderer->sub_time_left = (uint)lVar28 & 0xffff;
      return 0;
    }
  } while( true );
}

Assistant:

static int process_tick(DUMB_IT_SIGRENDERER *sigrenderer)
{
	DUMB_IT_SIGDATA *sigdata = sigrenderer->sigdata;

	// Set note vol/freq to vol/freq set for each channel

	if (sigrenderer->speed && --sigrenderer->tick == 0) {
		reset_tick_counts(sigrenderer);
		sigrenderer->tick = sigrenderer->speed;
		sigrenderer->rowcount--;
		if (sigrenderer->rowcount == 0) {
			sigrenderer->rowcount = 1;

#ifdef BIT_ARRAY_BULLSHIT
			if (sigrenderer->n_rows)
			{
#if 1
				/*
				if (bit_array_test(sigrenderer->played, sigrenderer->order * 256 + sigrenderer->row))
				{
					if (sigrenderer->callbacks->loop) {
						if ((*sigrenderer->callbacks->loop)(sigrenderer->callbacks->loop_data))
							return 1;
						bit_array_reset(sigrenderer->played);
						if (sigrenderer->speed == 0)
							goto speed0; // I love goto
					}
				}
				*/
#endif
				bit_array_set(sigrenderer->played, sigrenderer->order * 256 + sigrenderer->row);
				{
					int n;
					for (n = 0; n < DUMB_IT_N_CHANNELS; n++)
					{
						IT_CHANNEL * channel = &sigrenderer->channel[n];
						if (channel->played_patjump)
						{
							if (channel->played_patjump_order == sigrenderer->order)
							{
								bit_array_set(channel->played_patjump, sigrenderer->row);
							}
							/*
							else if ((channel->played_patjump_order & 0x7FFF) == sigrenderer->order)
							{
								channel->played_patjump_order |= 0x4000;
							}
							else if ((channel->played_patjump_order & 0x3FFF) == sigrenderer->order)
							{
								if ((sigdata->flags & (IT_WAS_AN_XM|IT_WAS_A_MOD)) == IT_WAS_AN_XM)
								{
									// joy, was XM, pattern loop bug triggered break to row in same order 
									bit_array_mask(sigrenderer->played, channel->played_patjump, sigrenderer->order * 256);
								}
								bit_array_destroy(channel->played_patjump);
								channel->played_patjump = 0;
								channel->played_patjump_order = 0xFFFE;
							}
							*/
							else
							{
								bit_array_destroy(channel->played_patjump);
								channel->played_patjump = 0;
								channel->played_patjump_order = 0xFFFE;
							}
						}
					}
				}
			}
#endif

			sigrenderer->processrow++;

			if (sigrenderer->processrow >= sigrenderer->n_rows) {
				IT_PATTERN *pattern;
				int n;
				int processorder = sigrenderer->processorder;

				if ((sigrenderer->processrow|0xC00) == 0xFFFE + 1) { /* It was incremented above! */
					sigrenderer->processrow = sigrenderer->breakrow;
					sigrenderer->breakrow = 0;
					for (n = 0; n < DUMB_IT_N_CHANNELS; n++) sigrenderer->channel[n].pat_loop_end_row = 0;
				} else {
					sigrenderer->processrow = sigrenderer->breakrow;
					sigrenderer->breakrow = 0; // XXX lolwut
				}

				if (sigrenderer->processorder == 0xFFFF)
					sigrenderer->processorder = sigrenderer->order - 1;

				for (;;) {
					sigrenderer->processorder++;

					if (sigrenderer->processorder >= sigdata->n_orders) {
						sigrenderer->processorder = sigrenderer->restart_position;
						if (sigrenderer->processorder >= sigdata->n_orders) {
							/* Restarting beyond end. We'll loop for now. */
							sigrenderer->processorder = -1;
							continue;
						}
						if (sigdata->flags & IT_WAS_AN_OKT) {
							/* Reset some things */
							sigrenderer->speed = sigdata->speed;
							sigrenderer->tempo = sigdata->tempo;
							for (n = 0; n < DUMB_IT_N_CHANNELS; n++) {
								xm_note_off(sigdata, &sigrenderer->channel[n]);
							}
						}
					}

					n = sigdata->order[sigrenderer->processorder];

					if (n < sigdata->n_patterns)
						break;

#ifdef INVALID_ORDERS_END_SONG
					if (n != IT_ORDER_SKIP)
#else
					if (n == IT_ORDER_END)
#endif
					{
						sigrenderer->processorder = sigrenderer->restart_position - 1;
					}

#ifdef BIT_ARRAY_BULLSHIT
					/* Fix play tracking and timekeeping for orders containing skip commands */
					for (n = 0; n < 256; n++) {
						bit_array_set(sigrenderer->played, sigrenderer->processorder * 256 + n);
					}
#endif
				}

				pattern = &sigdata->pattern[n];

				n = sigrenderer->n_rows;
				sigrenderer->n_rows = pattern->n_rows;

				if (sigrenderer->processrow >= sigrenderer->n_rows)
					sigrenderer->processrow = 0;

/** WARNING - everything pertaining to a new pattern initialised? */

				sigrenderer->entry = sigrenderer->entry_start = pattern->entry;
				sigrenderer->entry_end = sigrenderer->entry + pattern->n_entries;

				/* If n_rows was 0, we're only just starting. Don't do anything weird here. */
				/* added: process row check, for break to row spooniness */
				if (n && (processorder == 0xFFFF ? sigrenderer->order > sigrenderer->processorder : sigrenderer->order >= sigrenderer->processorder)
#ifdef BIT_ARRAY_BULLSHIT
					&& bit_array_test(sigrenderer->played, sigrenderer->processorder * 256 + sigrenderer->processrow)
#endif
					) {
					if (sigrenderer->callbacks->loop) {
						if ((*sigrenderer->callbacks->loop)(sigrenderer->callbacks->loop_data))
							return 1;
#ifdef BIT_ARRAY_BULLSHIT
						bit_array_reset(sigrenderer->played);
#endif
						if (sigrenderer->speed == 0)
							goto speed0; /* I love goto */
					}
				}
				sigrenderer->order = sigrenderer->processorder;

				n = sigrenderer->processrow;
				while (n) {
					while (sigrenderer->entry < sigrenderer->entry_end) {
						if (IT_IS_END_ROW(sigrenderer->entry)) {
							sigrenderer->entry++;
							break;
						}
						sigrenderer->entry++;
					}
					n--;
				}
				sigrenderer->row = sigrenderer->processrow;
			} else {
				if (sigrenderer->entry) {
					while (sigrenderer->entry < sigrenderer->entry_end) {
						if (IT_IS_END_ROW(sigrenderer->entry)) {
							sigrenderer->entry++;
							break;
						}
						sigrenderer->entry++;
					}
					sigrenderer->row++;
				} else {
#ifdef BIT_ARRAY_BULLSHIT
					bit_array_clear(sigrenderer->played, sigrenderer->order * 256);
#endif
					sigrenderer->entry = sigrenderer->entry_start;
					sigrenderer->row = 0;
				}
			}

			if (!(sigdata->flags & IT_WAS_A_669))
				reset_effects(sigrenderer);

			{
				IT_ENTRY *entry = sigrenderer->entry;
				int ignore_cxx = 0;

				while (entry < sigrenderer->entry_end && !IT_IS_END_ROW(entry))
					ignore_cxx |= update_pattern_variables(sigrenderer, entry++);

				entry = sigrenderer->entry;

				while (entry < sigrenderer->entry_end && !IT_IS_END_ROW(entry))
					if (process_entry(sigrenderer, entry++, sigdata->flags & IT_WAS_AN_XM ? 0 : ignore_cxx))
						return 1;
			}

			if (sigdata->flags & IT_WAS_AN_OKT)
				update_effects(sigrenderer);
			else if (!(sigdata->flags & IT_OLD_EFFECTS))
				update_smooth_effects(sigrenderer);
		} else {
			{
				IT_ENTRY *entry = sigrenderer->entry;

				while (entry < sigrenderer->entry_end && !IT_IS_END_ROW(entry)) {
					if (entry->mask & IT_ENTRY_EFFECT && entry->effect != IT_SET_SAMPLE_OFFSET)
						process_effects(sigrenderer, entry, 0);
							/* Don't bother checking the return value; if there
							 * was a pattern delay, there can't be a speed=0.
							 */
					entry++;
				}
			}

			update_effects(sigrenderer);
		}
	} else {
		if ( !(sigdata->flags & IT_WAS_AN_STM) || !(sigrenderer->tick & 15)) {
			speed0:
			update_effects(sigrenderer);
			update_tick_counts(sigrenderer);
		}
	}

	if (sigrenderer->globalvolume == 0) {
		if (sigrenderer->callbacks->global_volume_zero) {
			LONG_LONG t = sigrenderer->gvz_sub_time + ((TICK_TIME_DIVIDEND / (sigrenderer->tempo << 8)) << 16);
			sigrenderer->gvz_time += (int)(t >> 16);
			sigrenderer->gvz_sub_time = (int)t & 65535;
			if (sigrenderer->gvz_time >= 65536 * 12) {
				if ((*sigrenderer->callbacks->global_volume_zero)(sigrenderer->callbacks->global_volume_zero_data))
					return 1;
			}
		}
	} else {
		if (sigrenderer->callbacks->global_volume_zero) {
			sigrenderer->gvz_time = 0;
			sigrenderer->gvz_sub_time = 0;
		}
	}

	process_all_playing(sigrenderer);

	{
		LONG_LONG t = (TICK_TIME_DIVIDEND / (sigrenderer->tempo << 8)) << 16;
		if ( sigrenderer->sigdata->flags & IT_WAS_AN_STM ) {
			t /= 16;
		}
		t += sigrenderer->sub_time_left;
		sigrenderer->time_left += (int)(t >> 16);
		sigrenderer->sub_time_left = (int)t & 65535;
	}

	return 0;
}